

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsByteCodeGenerator.cpp
# Opt level: O2

EmitExpressionInfo __thiscall
Js::AsmJSByteCodeGenerator::EmitSwitch(AsmJSByteCodeGenerator *this,ParseNodeSwitch *pnode)

{
  AsmJsByteCodeWriter *this_00;
  ParseNodeCase *pPVar1;
  ParseNode *node;
  code *pcVar2;
  ParseNodeSwitch *pPVar3;
  bool bVar4;
  bool bVar5;
  RegSlot R0;
  ByteCodeLabel BVar6;
  undefined4 *puVar7;
  EmitExpressionInfo EVar8;
  AsmJsCompilationException *this_01;
  ParseNodeCase **ppPVar9;
  ParseNodePtr pnode_00;
  ParseNodeCase **ppPVar10;
  EmitExpressionInfo local_50;
  EmitExpressionInfo local_48;
  ParseNodeSwitch *local_40;
  RegSlot local_34;
  
  pnode_00 = pnode->pnodeVal;
  if (pnode_00 == (ParseNodePtr)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsByteCodeGenerator.cpp"
                                ,0x92d,"(pnode->pnodeVal != __null)","pnode->pnodeVal != NULL");
    if (!bVar4) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar7 = 0;
    pnode_00 = pnode->pnodeVal;
  }
  local_50 = Emit(this,pnode_00);
  bVar4 = AsmJsType::isSigned(&local_50.type);
  if (bVar4) {
    R0 = GetAndReleaseUnaryLocations<int>(this,&local_50);
    StartStatement(this,(ParseNode *)pnode);
    this_00 = &this->mWriter;
    local_34 = R0;
    AsmJsByteCodeWriter::AsmReg2(this_00,BeginSwitch_Int,R0,local_50.super_EmitInfoBase.location);
    ByteCodeWriter::EndStatement(&this_00->super_ByteCodeWriter,(ParseNode *)pnode);
    ppPVar10 = &pnode->pnodeCases;
    bVar4 = false;
    ppPVar9 = ppPVar10;
    local_40 = pnode;
    do {
      pPVar3 = local_40;
      pPVar1 = *ppPVar9;
      if (pPVar1 == (ParseNodeCase *)0x0) {
        if (bVar4) {
          BVar6 = local_40->pnodeDefault->labelCase;
        }
        else if ((local_40->super_ParseNodeStmt).emitLabels == true) {
          BVar6 = (local_40->super_ParseNodeStmt).breakLabel;
        }
        else {
          BVar6 = ByteCodeWriter::DefineLabel(&this_00->super_ByteCodeWriter);
          (pPVar3->super_ParseNodeStmt).breakLabel = BVar6;
        }
        AsmJsByteCodeWriter::AsmBr(this_00,BVar6,EndSwitch_Int);
        while (pPVar1 = *ppPVar10, pPVar1 != (ParseNodeCase *)0x0) {
          AsmJsByteCodeWriter::MarkAsmJsLabel(this_00,pPVar1->labelCase);
          local_48 = Emit(this,(ParseNode *)pPVar1->pnodeBody);
          AsmJsFunc::ReleaseLocationGeneric(this->mFunction,&local_48);
          ppPVar10 = &pPVar1->pnodeNext;
        }
        AsmJsFunc::ReleaseTmpRegister<int>(this->mFunction,local_34);
        if ((!bVar4) || ((local_40->super_ParseNodeStmt).emitLabels == true)) {
          AsmJsByteCodeWriter::MarkAsmJsLabel(this_00,(local_40->super_ParseNodeStmt).breakLabel);
        }
        EVar8.super_EmitInfoBase.location = 0xffffffff;
        EVar8.type.which_ = Void;
        return EVar8;
      }
      BVar6 = ByteCodeWriter::DefineLabel(&this_00->super_ByteCodeWriter);
      pPVar1->labelCase = BVar6;
      bVar5 = true;
      if (pPVar1 != local_40->pnodeDefault) {
        node = pPVar1->pnodeExpr;
        if (node->nop == knopInt) {
          ParseNode::AsParseNodeInt(node);
        }
        else {
          bVar5 = ParserWrapper::IsMinInt(node);
          if (!bVar5) {
            this_01 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
            AsmJsCompilationException::AsmJsCompilationException
                      (this_01,L"Switch case value must be int in the range [-2^31, 2^31)");
            goto LAB_008663d9;
          }
        }
        EVar8 = Emit(this,pPVar1->pnodeExpr);
        AsmJsByteCodeWriter::AsmBrReg2
                  (this_00,Case_Int,pPVar1->labelCase,local_34,
                   EVar8.super_EmitInfoBase.location.location);
        bVar5 = bVar4;
      }
      bVar4 = bVar5;
      ppPVar9 = &pPVar1->pnodeNext;
    } while( true );
  }
  this_01 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
  AsmJsCompilationException::AsmJsCompilationException
            (this_01,L"Switch value must be type Signed, FixNum");
LAB_008663d9:
  __cxa_throw(this_01,&AsmJsCompilationException::typeinfo,0);
}

Assistant:

EmitExpressionInfo AsmJSByteCodeGenerator::EmitSwitch( ParseNodeSwitch * pnode )
    {
        BOOL fHasDefault = false;
        Assert( pnode->pnodeVal != NULL );
        const EmitExpressionInfo& valInfo = Emit( pnode->pnodeVal );

        if( !valInfo.type.isSigned() )
        {
            throw AsmJsCompilationException( _u("Switch value must be type Signed, FixNum") );
        }

        RegSlot regVal = GetAndReleaseUnaryLocations<int>( &valInfo );
        StartStatement(pnode);
        mWriter.AsmReg2(OpCodeAsmJs::BeginSwitch_Int, regVal, valInfo.location);
        EndStatement(pnode);

        // TODO: if all cases are compile-time constants, emit a switch statement in the byte
        // code so the BE can optimize it.

        ParseNodeCase *pnodeCase;
        for( pnodeCase = pnode->pnodeCases; pnodeCase; pnodeCase = pnodeCase->pnodeNext )
        {
            // Jump to the first case body if this one doesn't match. Make sure any side-effects of the case
            // expression take place regardless.
            pnodeCase->labelCase = mWriter.DefineLabel();
            if( pnodeCase == pnode->pnodeDefault )
            {
                fHasDefault = true;
                continue;
            }
            ParseNode* caseExpr = pnodeCase->pnodeExpr;
            if ((caseExpr->nop != knopInt || (caseExpr->AsParseNodeInt()->lw >> 31) > 1) && !ParserWrapper::IsMinInt(caseExpr))
            {
                throw AsmJsCompilationException( _u("Switch case value must be int in the range [-2^31, 2^31)") );
            }

            const EmitExpressionInfo& caseExprInfo = Emit( pnodeCase->pnodeExpr );
            mWriter.AsmBrReg2( OpCodeAsmJs::Case_Int, pnodeCase->labelCase, regVal, caseExprInfo.location );
            // do not need to release location because int constants cannot be released
        }

        // No explicit case value matches. Jump to the default arm (if any) or break out altogether.
        if( fHasDefault )
        {
            mWriter.AsmBr( pnode->pnodeDefault->labelCase, OpCodeAsmJs::EndSwitch_Int );
        }
        else
        {
            if( !pnode->emitLabels )
            {
                pnode->breakLabel = mWriter.DefineLabel();
            }
            mWriter.AsmBr( pnode->breakLabel, OpCodeAsmJs::EndSwitch_Int );
        }
        // Now emit the case arms to which we jump on matching a case value.
        for( pnodeCase = pnode->pnodeCases; pnodeCase; pnodeCase = pnodeCase->pnodeNext )
        {
            mWriter.MarkAsmJsLabel( pnodeCase->labelCase );
            const EmitExpressionInfo& caseBodyInfo = Emit( pnodeCase->pnodeBody );
            mFunction->ReleaseLocationGeneric( &caseBodyInfo );
        }

        mFunction->ReleaseTmpRegister<int>( regVal );

        if( !fHasDefault || pnode->emitLabels )
        {
            mWriter.MarkAsmJsLabel( pnode->breakLabel );
        }

        return EmitExpressionInfo( AsmJsType::Void );
    }